

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

Matrix33d * gmath::createR(Matrix33d *__return_storage_ptr__,Vector3d *n,double phi)

{
  undefined8 uVar1;
  int i;
  long lVar2;
  undefined1 *puVar3;
  double (*padVar4) [3];
  undefined8 *puVar5;
  double *pdVar6;
  int k;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Matrix33d m3;
  Matrix33d m2;
  SMatrix<double,_3,_3> ret_2;
  SMatrix<double,_3,_3> ret_1;
  Matrix33d m1;
  undefined1 local_288 [16];
  double local_278;
  double dStack_270;
  undefined1 local_268 [16];
  double local_258;
  double dStack_250;
  undefined8 local_248;
  double local_238 [4];
  double local_218 [4];
  double local_1f8;
  SMatrix<double,_3,_3> local_1e8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  double local_158;
  SMatrix<double,_3,_3> local_148;
  undefined8 local_f8 [10];
  SMatrix<double,_3,_3> local_a8;
  SMatrix<double,_3,_3> local_60;
  
  __return_storage_ptr__->v[2][0] = 0.0;
  __return_storage_ptr__->v[2][1] = 0.0;
  __return_storage_ptr__->v[1][1] = 0.0;
  __return_storage_ptr__->v[1][2] = 0.0;
  __return_storage_ptr__->v[0][2] = 0.0;
  __return_storage_ptr__->v[1][0] = 0.0;
  __return_storage_ptr__->v[0][0] = 0.0;
  __return_storage_ptr__->v[0][1] = 0.0;
  __return_storage_ptr__->v[2][2] = 0.0;
  auVar14 = _DAT_00163c20;
  lVar2 = 0;
  auVar9 = _DAT_00163c10;
  do {
    auVar11 = auVar9 ^ auVar14;
    if (auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7ffffffd) {
      *(undefined8 *)((long)__return_storage_ptr__->v[0] + lVar2) = 0x3ff0000000000000;
      *(undefined8 *)((long)__return_storage_ptr__->v[1] + lVar2 + 8) = 0x3ff0000000000000;
    }
    lVar7 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x80);
  dVar8 = 0.0;
  lVar2 = 0;
  do {
    dVar8 = dVar8 + n->v[lVar2] * n->v[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
    auVar14 = _DAT_00163c20;
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  if (0.0 < dVar8) {
    local_f8[6] = 0;
    local_f8[7] = 0;
    local_f8[4] = 0;
    local_f8[5] = 0;
    local_f8[2] = 0;
    local_f8[3] = 0;
    local_f8[0] = 0;
    local_f8[1] = 0;
    local_f8[8] = 0;
    lVar2 = 0;
    auVar11 = _DAT_00163c10;
    do {
      if (SUB164(auVar11 ^ auVar14,4) == -0x80000000 && SUB164(auVar11 ^ auVar14,0) < -0x7ffffffd) {
        *(undefined8 *)((long)local_f8 + lVar2) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_f8 + lVar2 + 0x20) = 0x3ff0000000000000;
      }
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar7 + 2;
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0x80);
    lVar2 = 0;
    auVar12 = _DAT_00163c10;
    do {
      if (SUB164(auVar12 ^ auVar14,4) == -0x80000000 && SUB164(auVar12 ^ auVar14,0) < -0x7ffffffd) {
        *(undefined8 *)((long)local_238 + lVar2) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_218 + lVar2) = 0x3ff0000000000000;
      }
      lVar7 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar7 + 2;
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0x80);
    lVar2 = 0;
    auVar13 = _DAT_00163c10;
    do {
      if (SUB164(auVar13 ^ auVar14,4) == -0x80000000 && SUB164(auVar13 ^ auVar14,0) < -0x7ffffffd) {
        *(undefined8 *)(local_288 + lVar2) = 0x3ff0000000000000;
        *(undefined8 *)(local_268 + lVar2) = 0x3ff0000000000000;
      }
      lVar7 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar7 + 2;
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0x80);
    dStack_270 = n->v[2] / dVar8;
    auVar10._8_8_ = dVar8;
    auVar10._0_8_ = dVar8;
    auVar14 = divpd(*(undefined1 (*) [16])n->v,auVar10);
    lVar2 = 0;
    dStack_250 = auVar14._0_8_;
    local_278 = auVar14._8_8_;
    local_288._8_8_ = 0;
    local_288._0_8_ = -dStack_270;
    local_288 = local_288 << 0x40;
    local_238[1] = dStack_250 * local_278;
    local_238[0] = dStack_250 * dStack_250;
    local_268._8_8_ = 0;
    local_268._0_8_ = -dStack_250;
    local_268 = local_268 << 0x40;
    local_258 = -local_278;
    local_238[3] = dStack_250 * local_278;
    local_238[2] = dStack_270 * dStack_250;
    local_218[1] = dStack_270 * local_278;
    local_218[0] = local_278 * local_278;
    local_218[3] = dStack_270 * local_278;
    local_218[2] = dStack_270 * dStack_250;
    local_1f8 = dStack_270 * dStack_270;
    local_248 = 0;
    dVar8 = cos(phi);
    local_148.v[0][0] = 0.0;
    local_148.v[0][1] = 0.0;
    local_148.v[0][2] = 0.0;
    local_148.v[1][0] = 0.0;
    local_148.v[1][1] = 0.0;
    local_148.v[1][2] = 0.0;
    local_148.v[2][0] = 0.0;
    local_148.v[2][1] = 0.0;
    local_148.v[2][2] = 0.0;
    auVar14 = _DAT_00163c10;
    do {
      if (SUB164(auVar14 ^ _DAT_00163c20,4) == -0x80000000 &&
          SUB164(auVar14 ^ _DAT_00163c20,0) < -0x7ffffffd) {
        *(undefined8 *)((long)local_148.v[0] + lVar2) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_148.v[1] + lVar2 + 8) = 0x3ff0000000000000;
      }
      lVar7 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar7 + 2;
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0x80);
    padVar4 = (double (*) [3])&local_148;
    puVar5 = local_f8;
    lVar2 = 0;
    do {
      lVar7 = 0;
      do {
        (*(double (*) [3])*padVar4)[lVar7] = (double)puVar5[lVar7] * dVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar2 = lVar2 + 1;
      padVar4 = padVar4 + 1;
      puVar5 = puVar5 + 3;
    } while (lVar2 != 3);
    dVar8 = cos(phi);
    local_198 = (undefined1  [16])0x0;
    local_188 = (undefined1  [16])0x0;
    local_178 = (undefined1  [16])0x0;
    local_168 = (undefined1  [16])0x0;
    local_158 = 0.0;
    lVar2 = 0;
    auVar15 = _DAT_00163c10;
    do {
      if (SUB164(auVar15 ^ _DAT_00163c20,4) == -0x80000000 &&
          SUB164(auVar15 ^ _DAT_00163c20,0) < -0x7ffffffd) {
        *(undefined8 *)(local_198 + lVar2) = 0x3ff0000000000000;
        *(undefined8 *)(local_178 + lVar2) = 0x3ff0000000000000;
      }
      lVar7 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar7 + 2;
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0x80);
    puVar3 = local_198;
    pdVar6 = local_238;
    lVar2 = 0;
    do {
      lVar7 = 0;
      do {
        *(double *)(puVar3 + lVar7 * 8) = pdVar6[lVar7] * (1.0 - dVar8);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar2 = lVar2 + 1;
      puVar3 = puVar3 + 0x18;
      pdVar6 = pdVar6 + 3;
    } while (lVar2 != 3);
    SMatrix<double,_3,_3>::operator+(&local_60,&local_148,(SMatrix<double,_3,_3> *)local_198);
    dVar8 = sin(phi);
    local_1e8.v[0][0] = 0.0;
    local_1e8.v[0][1] = 0.0;
    local_1e8.v[0][2] = 0.0;
    local_1e8.v[1][0] = 0.0;
    local_1e8.v[1][1] = 0.0;
    local_1e8.v[1][2] = 0.0;
    local_1e8.v[2][0] = 0.0;
    local_1e8.v[2][1] = 0.0;
    local_1e8.v[2][2] = 0.0;
    lVar2 = 0;
    auVar16 = _DAT_00163c10;
    do {
      if (SUB164(auVar16 ^ _DAT_00163c20,4) == -0x80000000 &&
          SUB164(auVar16 ^ _DAT_00163c20,0) < -0x7ffffffd) {
        *(undefined8 *)((long)local_1e8.v[0] + lVar2) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_1e8.v[1] + lVar2 + 8) = 0x3ff0000000000000;
      }
      lVar7 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar7 + 2;
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0x80);
    padVar4 = (double (*) [3])&local_1e8;
    puVar3 = local_288;
    lVar2 = 0;
    do {
      lVar7 = 0;
      do {
        (*(double (*) [3])*padVar4)[lVar7] = *(double *)(puVar3 + lVar7 * 8) * dVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar2 = lVar2 + 1;
      padVar4 = padVar4 + 1;
      puVar3 = puVar3 + 0x18;
    } while (lVar2 != 3);
    SMatrix<double,_3,_3>::operator+(&local_a8,&local_60,&local_1e8);
    lVar2 = 0;
    do {
      *(undefined8 *)((long)__return_storage_ptr__->v[0] + lVar2 + 0x10) =
           *(undefined8 *)((long)local_a8.v[0] + lVar2 + 0x10);
      uVar1 = *(undefined8 *)((long)local_a8.v[0] + lVar2 + 8);
      puVar5 = (undefined8 *)((long)__return_storage_ptr__->v[0] + lVar2);
      *puVar5 = *(undefined8 *)((long)local_a8.v[0] + lVar2);
      puVar5[1] = uVar1;
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x48);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createR(const Vector3d &n, double phi)
{
  Matrix33d R;

  double l=norm(n);

  if (l > 0)
  {
    Matrix33d m1, m2, m3;

    double n1=n[0]/l;
    double n2=n[1]/l;
    double n3=n[2]/l;

    m2(0, 0)=n1*n1; m2(0, 1)=n1*n2; m2(0, 2)=n1*n3;
    m2(1, 0)=n2*n1; m2(1, 1)=n2*n2; m2(1, 2)=n2*n3;
    m2(2, 0)=n3*n1; m2(2, 1)=n3*n2; m2(2, 2)=n3*n3;

    m3(0, 0)=  0; m3(0, 1)=-n3; m3(0, 2)= n2;
    m3(1, 0)= n3; m3(1, 1)=  0; m3(1, 2)=-n1;
    m3(2, 0)=-n2; m3(2, 1)= n1; m3(2, 2)=  0;

    R=cos(phi)*m1 + (1-cos(phi))*m2 + sin(phi)*m3;
  }

  return R;
}